

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerFrame.hpp
# Opt level: O1

void * Husky::ServerFrame::ServerThread(void *lpParameter)

{
  int __fd;
  size_type sVar1;
  int __fd_00;
  int iVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  int *piVar5;
  char *pcVar6;
  ssize_t sVar7;
  pthread_mutex_t *__mutex;
  _Alloc_hider _Var8;
  socklen_t nSize;
  string strSnd;
  string strRec;
  string strHttpResp;
  linger lng;
  sockaddr_in clientaddr;
  HttpReqInfo httpReq;
  char chHttpHeader [2048];
  char chRecvBuf [10240];
  socklen_t local_3194;
  undefined1 *local_3190;
  ulong local_3188;
  undefined1 local_3180 [16];
  string local_3170;
  undefined1 *local_3150;
  char *local_3148;
  undefined1 local_3140 [16];
  long *local_3130;
  char *local_3128;
  pthread_mutex_t *local_3120;
  undefined8 local_3118;
  string local_3110;
  undefined1 local_30f0 [16];
  HttpReqInfo local_30e0;
  key_type local_3038 [64];
  char local_2838 [10248];
  
  __fd = *lpParameter;
  local_3130 = *(long **)((long)lpParameter + 8);
  pcVar6 = *(char **)((long)lpParameter + 0x18);
  __mutex = *(pthread_mutex_t **)((long)lpParameter + 0x10);
  local_3150 = local_3140;
  local_3148 = (char *)0x0;
  local_3140[0] = 0;
  local_3194 = 0x10;
  if (*pcVar6 == '\0') {
    local_3128 = pcVar6;
    local_3120 = __mutex;
    do {
      local_30e0._headerMap._M_h._M_buckets = &local_30e0._headerMap._M_h._M_single_bucket;
      local_30e0._headerMap._M_h._M_bucket_count = 1;
      local_30e0._headerMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_30e0._headerMap._M_h._M_element_count = 0;
      local_30e0._headerMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_30e0._headerMap._M_h._M_rehash_policy._M_next_resize = 0;
      local_30e0._headerMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_30e0._methodGetMap._M_h._M_buckets = &local_30e0._methodGetMap._M_h._M_single_bucket;
      local_30e0._methodGetMap._M_h._M_bucket_count = 1;
      local_30e0._methodGetMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_30e0._methodGetMap._M_h._M_element_count = 0;
      local_30e0._methodGetMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_30e0._methodGetMap._M_h._M_rehash_policy._M_next_resize = 0;
      local_30e0._methodGetMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_30e0._methodPostMap._M_h._M_buckets = &local_30e0._methodPostMap._M_h._M_single_bucket;
      local_30e0._methodPostMap._M_h._M_bucket_count = 1;
      local_30e0._methodPostMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_30e0._methodPostMap._M_h._M_element_count = 0;
      local_30e0._methodPostMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_30e0._methodPostMap._M_h._M_rehash_policy._M_next_resize = 0;
      local_30e0._methodPostMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
      pthread_mutex_lock(__mutex);
      __fd_00 = accept(__fd,(sockaddr *)local_30f0,&local_3194);
      pthread_mutex_unlock(__mutex);
      if (__fd_00 == -1) {
        if (*pcVar6 == '\0') {
          local_3038[0]._M_dataplus._M_p = (pointer)&local_3038[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3038,"error [%s]","");
          piVar5 = __errno_location();
          pcVar3 = strerror(*piVar5);
          Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0xe4,local_3038,pcVar3);
          _Var8._M_p = local_3038[0]._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3038[0]._M_dataplus._M_p != &local_3038[0].field_2) goto LAB_00114437;
        }
      }
      else {
        pcVar3 = inet_ntoa((in_addr)local_30f0._4_4_);
        local_3038[0]._M_dataplus._M_p = (pointer)&local_3038[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3038,"CLIENT_IP","");
        pmVar4 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&local_30e0,local_3038);
        pcVar6 = (char *)pmVar4->_M_string_length;
        strlen(pcVar3);
        std::__cxx11::string::_M_replace((ulong)pmVar4,0,pcVar6,(ulong)pcVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3038[0]._M_dataplus._M_p != &local_3038[0].field_2) {
          operator_delete(local_3038[0]._M_dataplus._M_p);
        }
        local_3118 = 0x100000001;
        iVar2 = setsockopt(__fd_00,1,0xd,&local_3118,8);
        if (iVar2 == -1) {
          local_3038[0]._M_dataplus._M_p = (pointer)&local_3038[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3038,"error [%s]","");
          piVar5 = __errno_location();
          pcVar6 = strerror(*piVar5);
          Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0xee,local_3038,pcVar6);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3038[0]._M_dataplus._M_p != &local_3038[0].field_2) {
            operator_delete(local_3038[0]._M_dataplus._M_p);
          }
        }
        iVar2 = setsockopt(__fd_00,1,0x14,SOCKET_TIMEOUT,0x10);
        if (iVar2 == -1) {
          local_3038[0]._M_dataplus._M_p = (pointer)&local_3038[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3038,"error [%s]","");
          piVar5 = __errno_location();
          pcVar6 = strerror(*piVar5);
          Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0xf3,local_3038,pcVar6);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3038[0]._M_dataplus._M_p != &local_3038[0].field_2) {
            operator_delete(local_3038[0]._M_dataplus._M_p);
          }
        }
        iVar2 = setsockopt(__fd_00,1,0x15,SOCKET_TIMEOUT,0x10);
        if (iVar2 == -1) {
          local_3038[0]._M_dataplus._M_p = (pointer)&local_3038[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3038,"error [%s]","");
          piVar5 = __errno_location();
          pcVar6 = strerror(*piVar5);
          Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0xf8,local_3038,pcVar6);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3038[0]._M_dataplus._M_p != &local_3038[0].field_2) {
            operator_delete(local_3038[0]._M_dataplus._M_p);
          }
        }
        local_3170._M_string_length = 0;
        local_3170.field_2._M_local_buf[0] = '\0';
        local_3190 = local_3180;
        local_3188 = 0;
        local_3180[0] = 0;
        local_3170._M_dataplus._M_p = (pointer)&local_3170.field_2;
        memset(local_2838,0,0x2800);
        sVar7 = recv(__fd_00,local_2838,0x2800,0);
        sVar1 = local_3170._M_string_length;
        strlen(local_2838);
        std::__cxx11::string::_M_replace((ulong)&local_3170,0,(char *)sVar1,(ulong)local_2838);
        if ((int)sVar7 == 0) {
          local_3038[0]._M_dataplus._M_p = (pointer)&local_3038[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3038,"connection has been gracefully closed","");
          Limonp::Logger::LoggingF(0,"ServerFrame.hpp",0x10e,local_3038);
LAB_001142d7:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3038[0]._M_dataplus._M_p != &local_3038[0].field_2) {
            operator_delete(local_3038[0]._M_dataplus._M_p);
          }
          close(__fd_00);
        }
        else {
          if ((int)sVar7 == -1) {
            local_3038[0]._M_dataplus._M_p = (pointer)&local_3038[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_3038,"error [%s]","");
            piVar5 = __errno_location();
            pcVar6 = strerror(*piVar5);
            Limonp::Logger::LoggingF(0,"ServerFrame.hpp",0x108,local_3038,pcVar6);
            goto LAB_001142d7;
          }
          HttpReqInfo::load(&local_30e0,&local_3170);
          (**(code **)(*local_3130 + 0x20))(local_3130,&local_30e0,&local_3190);
          sprintf((char *)local_3038,
                  "HTTP/1.1 200 OK\r\nConnection: close\r\nServer: FrameServer/1.0.0\r\nContent-Type: text/json; charset=%s\r\nContent-Length: %d\r\n\r\n"
                  ,"UTF-8",local_3188 & 0xffffffff);
          pcVar6 = local_3148;
          strlen((char *)local_3038);
          std::__cxx11::string::_M_replace((ulong)&local_3150,0,pcVar6,(ulong)local_3038);
          std::__cxx11::string::_M_append((char *)&local_3150,(ulong)local_3190);
          sVar7 = send(__fd_00,local_3150,(size_t)local_3148,0);
          if (sVar7 == -1) {
            local_3110._M_dataplus._M_p = (pointer)&local_3110.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3110,"error [%s]","");
            piVar5 = __errno_location();
            pcVar6 = strerror(*piVar5);
            Limonp::Logger::LoggingF(3,"ServerFrame.hpp",0x122,&local_3110,pcVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3110._M_dataplus._M_p != &local_3110.field_2) {
              operator_delete(local_3110._M_dataplus._M_p);
            }
          }
          close(__fd_00);
        }
        if (local_3190 != local_3180) {
          operator_delete(local_3190);
        }
        __mutex = local_3120;
        pcVar6 = local_3128;
        _Var8._M_p = local_3170._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3170._M_dataplus._M_p != &local_3170.field_2) {
LAB_00114437:
          operator_delete(_Var8._M_p);
        }
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_30e0._methodPostMap._M_h);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_30e0._methodGetMap._M_h);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&local_30e0);
    } while (*pcVar6 == '\0');
  }
  if (local_3150 != local_3140) {
    operator_delete(local_3150);
  }
  return (void *)0x0;
}

Assistant:

static void * ServerThread(void * lpParameter )
            {
                SPara *pPara=(SPara*)lpParameter;
                SOCKET hSockLsn=pPara->hSock;
                IRequestHandler *pHandler=pPara->pHandler;
                bool* pShutdown = pPara->pShutdown;
                pthread_mutex_t* ppmAccept = pPara->ppmAccept;

                int nRetCode;
                linger lng;
                char chRecvBuf[RECV_BUFFER];

                SOCKET hClientSock;
                string strHttpResp;

                sockaddr_in clientaddr;
                socklen_t nSize = sizeof(clientaddr);
                while(!(*pShutdown))
                {		
                    HttpReqInfo httpReq;
                    pthread_mutex_lock(ppmAccept);
                    hClientSock=accept(hSockLsn,(sockaddr *)&clientaddr, &nSize);
                    pthread_mutex_unlock(ppmAccept);

                    if(hClientSock==SOCKET_ERROR)
                    {
                        if(!(*pShutdown))
                          LogError("error [%s]", strerror(errno));
                        continue;
                    }

                    httpReq[CLIENT_IP_K] = inet_ntoa(clientaddr.sin_addr);// inet_ntoa is not thread safety at some version 

                    lng.l_linger=1;
                    lng.l_onoff=1;				
                    if(SOCKET_ERROR==setsockopt(hClientSock,SOL_SOCKET,SO_LINGER,(char*)&lng,sizeof(lng)))			
                    {
                        LogError("error [%s]", strerror(errno));
                    }

                    if(SOCKET_ERROR==setsockopt(hClientSock,SOL_SOCKET,SO_RCVTIMEO,(char*)&SOCKET_TIMEOUT,sizeof(SOCKET_TIMEOUT)))
                    {
                        LogError("error [%s]", strerror(errno));
                    }

                    if(SOCKET_ERROR==setsockopt(hClientSock,SOL_SOCKET,SO_SNDTIMEO,(char*)&SOCKET_TIMEOUT,sizeof(SOCKET_TIMEOUT)))
                    {
                        LogError("error [%s]", strerror(errno));
                    }


                    string strRec;
                    string strSnd;
                    memset(chRecvBuf,0,sizeof(chRecvBuf));
                    nRetCode = recv(hClientSock, chRecvBuf, RECV_BUFFER, 0);	
                    strRec = chRecvBuf;

#ifdef HUKSY_DEBUG
                    LogDebug("request[%s]", strRec.c_str());
#endif

                    if(SOCKET_ERROR==nRetCode)
                    {
                        LogDebug("error [%s]", strerror(errno));
                        closesocket(hClientSock);
                        continue;
                    }
                    if(0==nRetCode)
                    {
                        LogDebug("connection has been gracefully closed");
                        closesocket(hClientSock);
                        continue;
                    }
                    httpReq.load(strRec);

                    pHandler->do_GET(httpReq, strSnd);

                    char chHttpHeader[2048];

                    sprintf(chHttpHeader, RESPONSE_FORMAT, RESPONSE_CHARSET_UTF8, int(strSnd.length()));

                    strHttpResp=chHttpHeader;
                    strHttpResp+=strSnd;
#ifdef HUKSY_DEBUG
                    LogDebug("response'body [%s]", strSnd.c_str());
#endif

                    if (SOCKET_ERROR==send(hClientSock,strHttpResp.c_str(),strHttpResp.length(),0))
                    {
                        LogError("error [%s]", strerror(errno));
                    }


                    closesocket(hClientSock);
                }

                return 0;

            }